

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O1

void __thiscall
nuraft::nuraft_global_mgr::request_commit(nuraft_global_mgr *this,ptr<raft_server> *server)

{
  mutex *__mutex;
  unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
  *this_00;
  size_t *psVar1;
  element_type *peVar2;
  element_type *peVar3;
  int iVar4;
  __node_base_ptr p_Var5;
  _Node *p_Var6;
  pointer psVar7;
  __hashtable *__h;
  bool bVar8;
  __node_gen_type __node_gen;
  string local_50;
  
  __mutex = &this->commit_queue_lock_;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  this_00 = &this->commit_server_set_;
  peVar2 = (server->super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var5 = std::
           _Hashtable<std::shared_ptr<nuraft::raft_server>,_std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::_M_find_before_node
                     (&this_00->_M_h,(ulong)peVar2 % (this->commit_server_set_)._M_h._M_bucket_count
                      ,server,(__hash_code)peVar2);
  if (p_Var5 == (__node_base_ptr)0x0) {
    bVar8 = false;
  }
  else {
    bVar8 = p_Var5->_M_nxt != (_Hash_node_base *)0x0;
  }
  if (!bVar8) {
    p_Var6 = std::__cxx11::
             list<std::shared_ptr<nuraft::raft_server>,std::allocator<std::shared_ptr<nuraft::raft_server>>>
             ::_M_create_node<std::shared_ptr<nuraft::raft_server>const&>
                       ((list<std::shared_ptr<nuraft::raft_server>,std::allocator<std::shared_ptr<nuraft::raft_server>>>
                         *)&this->commit_queue_,server);
    std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
    psVar1 = &(this->commit_queue_).
              super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    local_50._M_dataplus._M_p = (pointer)this_00;
    std::
    _Hashtable<std::shared_ptr<nuraft::raft_server>,std::shared_ptr<nuraft::raft_server>,std::allocator<std::shared_ptr<nuraft::raft_server>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<nuraft::raft_server>>,std::hash<std::shared_ptr<nuraft::raft_server>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<std::shared_ptr<nuraft::raft_server>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::shared_ptr<nuraft::raft_server>,false>>>>
              ((_Hashtable<std::shared_ptr<nuraft::raft_server>,std::shared_ptr<nuraft::raft_server>,std::allocator<std::shared_ptr<nuraft::raft_server>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<nuraft::raft_server>>,std::hash<std::shared_ptr<nuraft::raft_server>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this_00,server);
    peVar2 = (server->super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar3 = (peVar2->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar4 = (*peVar3->_vptr_logger[7])(), 5 < iVar4)) {
      peVar3 = (peVar2->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_50,"added commit request to global queue, server %p, queue length %zu",
                 (server->super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,(this->commit_queue_).
                        super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                        ._M_impl._M_node._M_size);
      (*peVar3->_vptr_logger[8])
                (peVar3,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                 ,"request_commit",0xff,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    psVar7 = (this->commit_workers_).
             super__Vector_base<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (psVar7 == (this->commit_workers_).
                    super__Vector_base<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        return;
      }
      if ((((psVar7->
            super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr)->status_)._M_i == SLEEPING) break;
      psVar7 = psVar7 + 1;
    }
    EventAwaiter::invoke
              (&((psVar7->
                 super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->ea_);
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void nuraft_global_mgr::request_commit(ptr<raft_server> server) {
    {
        std::lock_guard<std::mutex> l(commit_queue_lock_);
        // First search the set if the server is duplicate.
        auto entry = commit_server_set_.find(server);
        if (entry != commit_server_set_.end()) {
            // `server` is already in the queue. Ignore it.
            return;
        }

        // Put into queue.
        commit_queue_.push_back(server);
        commit_server_set_.insert(server);

        ptr<logger>& l_ = server->l_;
        p_tr("added commit request to global queue, "
             "server %p, queue length %zu",
             server.get(),
             commit_queue_.size());
    }

    // Find a sleeping worker and invoke.
    for (auto& entry: commit_workers_) {
        ptr<worker_handle>& wh = entry;
        if (wh->status_ == worker_handle::SLEEPING) {
            wh->ea_.invoke();
            break;
        }
    }
    // If all workers are working, nothing to do for now.
}